

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmtable.cpp
# Opt level: O1

char * ufmt_getDecNumChars_63(UFormattable *fmt,int32_t *len,UErrorCode *status)

{
  CharString *pCVar1;
  char *pcVar2;
  
  pcVar2 = "";
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    pCVar1 = icu_63::Formattable::internalGetCharString((Formattable *)fmt,status);
    if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
      if (pCVar1 == (CharString *)0x0) {
        *status = U_MEMORY_ALLOCATION_ERROR;
      }
      else {
        if (len != (int32_t *)0x0) {
          *len = pCVar1->len;
        }
        pcVar2 = (pCVar1->buffer).ptr;
      }
    }
  }
  return pcVar2;
}

Assistant:

U_DRAFT const char * U_EXPORT2
ufmt_getDecNumChars(UFormattable *fmt, int32_t *len, UErrorCode *status) {
  if(U_FAILURE(*status)) {
    return "";
  }
  Formattable *obj = Formattable::fromUFormattable(fmt);
  CharString *charString = obj->internalGetCharString(*status);
  if(U_FAILURE(*status)) {
    return "";
  }
  if(charString == NULL) {
    *status = U_MEMORY_ALLOCATION_ERROR;
    return "";
  } else {
    if(len!=NULL) {
      *len = charString->length();
    }
    return charString->data();
  }
}